

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joynu.c
# Opt level: O2

char * al_get_joystick_axis_name(ALLEGRO_JOYSTICK *joy,int stick,int axis)

{
  if ((stick < (joy->info).num_sticks) && (axis < (joy->info).stick[stick].num_axes)) {
    return (joy->info).stick[stick].axis[axis].name;
  }
  return (char *)0x0;
}

Assistant:

const char *al_get_joystick_axis_name(ALLEGRO_JOYSTICK *joy, int stick, int axis)
{
   ASSERT(joy);
   ASSERT(stick >= 0);
   ASSERT(axis >= 0);

   if (stick < joy->info.num_sticks)
      if (axis < joy->info.stick[stick].num_axes)
         return joy->info.stick[stick].axis[axis].name;

   return NULL;
}